

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodedstream.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseValue<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  char *pcVar1;
  byte bVar2;
  char *pcVar3;
  Ch *pCVar4;
  double dVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar9;
  MemoryStream *extraout_RAX;
  MemoryStream *pMVar10;
  byte *pbVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  byte *pbVar15;
  char *pcVar16;
  byte *pbVar17;
  uint16_t uVar18;
  byte *extraout_RDX;
  GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *unaff_RBX;
  uint uVar19;
  SizeType SVar20;
  int iVar21;
  undefined4 uVar22;
  byte *pbVar23;
  byte *pbVar24;
  char *pcVar25;
  ushort uVar26;
  GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *unaff_R12;
  int iVar27;
  int iVar28;
  undefined4 unaff_R13D;
  ulong uVar29;
  ulong uVar30;
  EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *unaff_R14;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *unaff_R15;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  Number NStack_48;
  
  pbVar17 = (byte *)is->is_->src_;
  if (pbVar17 != (byte *)is->is_->end_) {
    bVar2 = *pbVar17;
    if (bVar2 < 0x6e) {
      if (bVar2 == 0x22) {
        ParseString<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (this,is,handler,false);
        return;
      }
      if (bVar2 != 0x5b) {
        if (bVar2 != 0x66) {
          ParseNumber<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (this,is,handler);
          return;
        }
        pMVar10 = is->is_;
        pcVar16 = pMVar10->src_;
        pcVar3 = pMVar10->end_;
        if ((pcVar16 == pcVar3) || (*pcVar16 != 'f')) {
          ParseFalse<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    ();
        }
        else {
          pcVar1 = pcVar16 + 1;
          pMVar10->src_ = pcVar1;
          pcVar25 = pcVar3;
          if ((pcVar1 != pcVar3) && (pcVar25 = pcVar1, *pcVar1 == 'a')) {
            pcVar1 = pcVar16 + 2;
            pMVar10->src_ = pcVar1;
            pcVar25 = pcVar3;
            if ((pcVar1 != pcVar3) && (pcVar25 = pcVar1, *pcVar1 == 'l')) {
              pcVar1 = pcVar16 + 3;
              pMVar10->src_ = pcVar1;
              pcVar25 = pcVar3;
              if ((pcVar1 != pcVar3) && (pcVar25 = pcVar1, *pcVar1 == 's')) {
                pcVar1 = pcVar16 + 4;
                pMVar10->src_ = pcVar1;
                pcVar25 = pcVar3;
                if ((pcVar1 != pcVar3) && (pcVar25 = pcVar1, *pcVar1 == 'e')) {
                  pMVar10->src_ = pcVar16 + 5;
                  pGVar9 = internal::Stack<rapidjson::CrtAllocator>::
                           Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                                     (&handler->stack_,1);
                  (pGVar9->data_).n = (Number)0x0;
                  (pGVar9->data_).s.str = (Ch *)0x0;
                  (pGVar9->data_).f.flags = 9;
                  return;
                }
              }
            }
          }
          if (*(int *)(this + 0x30) == 0) {
            pCVar4 = pMVar10->begin_;
            *(undefined4 *)(this + 0x30) = 3;
            *(long *)(this + 0x38) = (long)pcVar25 - (long)pCVar4;
            return;
          }
        }
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                      ,0x37b,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      pMVar10 = is->is_;
      pcVar16 = pMVar10->src_;
      if ((pcVar16 == pMVar10->end_) || (*pcVar16 != '[')) {
        ParseArray<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  ();
LAB_00143ed8:
        ParseArray<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (unaff_R12);
        this = unaff_RBX;
        is = unaff_R14;
      }
      else {
        pMVar10->src_ = pcVar16 + 1;
        pGVar9 = internal::Stack<rapidjson::CrtAllocator>::
                 Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                           (&handler->stack_,1);
        (pGVar9->data_).n = (Number)0x0;
        (pGVar9->data_).s.str = (Ch *)0x0;
        (pGVar9->data_).f.flags = 4;
        pMVar10 = is->is_;
        pbVar17 = (byte *)pMVar10->src_;
        while (((pbVar17 != (byte *)pMVar10->end_ && ((ulong)*pbVar17 < 0x21)) &&
               ((0x100002600U >> ((ulong)*pbVar17 & 0x3f) & 1) != 0))) {
          pbVar17 = pbVar17 + 1;
          pMVar10->src_ = (Ch *)pbVar17;
        }
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        unaff_R12 = this + 0x30;
        if ((pbVar17 != (byte *)pMVar10->end_) && (*pbVar17 == 0x5d)) {
          pMVar10->src_ = (Ch *)(pbVar17 + 1);
          bVar8 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  ::EndArray(handler,0);
          unaff_RBX = this;
          unaff_R14 = is;
          if (bVar8) {
            return;
          }
          goto LAB_00143ed8;
        }
        ParseValue<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (this,is,handler);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        SVar20 = 0;
        while( true ) {
          pMVar10 = is->is_;
          pbVar11 = (byte *)pMVar10->src_;
          pbVar17 = (byte *)pMVar10->end_;
          while (((pbVar11 != pbVar17 && ((ulong)*pbVar11 < 0x21)) &&
                 ((0x100002600U >> ((ulong)*pbVar11 & 0x3f) & 1) != 0))) {
            pbVar11 = pbVar11 + 1;
            pMVar10->src_ = (Ch *)pbVar11;
          }
          uVar22 = 7;
          if (pbVar11 == pbVar17) goto LAB_00143eeb;
          SVar20 = SVar20 + 1;
          if (*pbVar11 != 0x2c) break;
          do {
            pbVar11 = pbVar11 + 1;
            pMVar10->src_ = (Ch *)pbVar11;
            if ((pbVar11 == pbVar17) || (0x20 < (ulong)*pbVar11)) break;
          } while ((0x100002600U >> ((ulong)*pbVar11 & 0x3f) & 1) != 0);
          ParseValue<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (this,is,handler);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
        }
        if (*pbVar11 != 0x5d) goto LAB_00143eeb;
        pMVar10->src_ = (Ch *)(pbVar11 + 1);
        bVar8 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::EndArray(handler,SVar20);
        if (bVar8) {
          return;
        }
        ParseArray<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (unaff_R12);
      }
      pMVar10 = is->is_;
      pbVar11 = (byte *)pMVar10->src_;
      uVar22 = 0x10;
LAB_00143eeb:
      pCVar4 = pMVar10->begin_;
      *(undefined4 *)(this + 0x30) = uVar22;
      *(long *)(this + 0x38) = (long)pbVar11 - (long)pCVar4;
      return;
    }
    if (bVar2 == 0x7b) {
      pMVar10 = is->is_;
      pcVar16 = pMVar10->src_;
      if ((pcVar16 == pMVar10->end_) || (*pcVar16 != '{')) {
        ParseObject<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  ();
        uVar19 = (uint)pcVar16;
        pMVar10 = extraout_RAX;
        pbVar17 = extraout_RDX;
      }
      else {
        pMVar10->src_ = pcVar16 + 1;
        pGVar9 = internal::Stack<rapidjson::CrtAllocator>::
                 Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                           (&handler->stack_,1);
        (pGVar9->data_).n = (Number)0x0;
        (pGVar9->data_).s.str = (Ch *)0x0;
        (pGVar9->data_).f.flags = 3;
        pMVar10 = is->is_;
        pbVar17 = (byte *)pMVar10->src_;
        pbVar11 = (byte *)pMVar10->end_;
        while (((pbVar17 != pbVar11 && ((ulong)*pbVar17 < 0x21)) &&
               ((0x100002600U >> ((ulong)*pbVar17 & 0x3f) & 1) != 0))) {
          pbVar17 = pbVar17 + 1;
          pMVar10->src_ = (Ch *)pbVar17;
        }
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        unaff_R13D = 4;
        unaff_RBX = this;
        if (pbVar17 == pbVar11) goto LAB_00143d6f;
        unaff_R12 = this + 0x30;
        uVar19 = (uint)*pbVar17;
        unaff_R14 = is;
        unaff_R15 = handler;
        unaff_R13D = 4;
        if (*pbVar17 == 0x7d) {
          pMVar10->src_ = (Ch *)(pbVar17 + 1);
          bVar8 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  ::EndObject(handler,0);
          if (bVar8) {
            return;
          }
          ParseObject<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (unaff_R12);
LAB_00143d33:
          pMVar10 = unaff_R14->is_;
          unaff_R13D = 0x10;
          pbVar11 = (byte *)pMVar10->src_;
          goto LAB_00143d6f;
        }
      }
      pbVar11 = pbVar17;
      if (uVar19 == 0x22) {
        SVar20 = 0;
        do {
          ParseString<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (unaff_RBX,unaff_R14,unaff_R15,true);
          if (*(int *)(unaff_RBX + 0x30) != 0) {
            return;
          }
          pMVar10 = unaff_R14->is_;
          pbVar11 = (byte *)pMVar10->src_;
          pbVar17 = (byte *)pMVar10->end_;
          while (((pbVar11 != pbVar17 && ((ulong)*pbVar11 < 0x21)) &&
                 ((0x100002600U >> ((ulong)*pbVar11 & 0x3f) & 1) != 0))) {
            pbVar11 = pbVar11 + 1;
            pMVar10->src_ = (Ch *)pbVar11;
          }
          if ((pbVar11 == pbVar17) || (*pbVar11 != 0x3a)) {
            unaff_R13D = 5;
            break;
          }
          do {
            pbVar11 = pbVar11 + 1;
            pMVar10->src_ = (Ch *)pbVar11;
            if ((pbVar11 == pbVar17) || (0x20 < (ulong)*pbVar11)) break;
          } while ((0x100002600U >> ((ulong)*pbVar11 & 0x3f) & 1) != 0);
          ParseValue<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (unaff_RBX,unaff_R14,unaff_R15);
          if (*(int *)(unaff_RBX + 0x30) != 0) {
            return;
          }
          pMVar10 = unaff_R14->is_;
          pbVar17 = (byte *)pMVar10->src_;
          pbVar11 = (byte *)pMVar10->end_;
          while (((pbVar17 != pbVar11 && ((ulong)*pbVar17 < 0x21)) &&
                 ((0x100002600U >> ((ulong)*pbVar17 & 0x3f) & 1) != 0))) {
            pbVar17 = pbVar17 + 1;
            pMVar10->src_ = (Ch *)pbVar17;
          }
          if (pbVar17 == pbVar11) {
LAB_00143d69:
            unaff_R13D = 6;
            break;
          }
          SVar20 = SVar20 + 1;
          if (*pbVar17 != 0x2c) {
            pbVar11 = pbVar17;
            if (*pbVar17 != 0x7d) goto LAB_00143d69;
            pMVar10->src_ = (Ch *)(pbVar17 + 1);
            bVar8 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                    ::EndObject(unaff_R15,SVar20);
            if (bVar8) {
              return;
            }
            ParseObject<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                      (unaff_R12);
            goto LAB_00143d33;
          }
          do {
            pbVar17 = pbVar17 + 1;
            pMVar10->src_ = (Ch *)pbVar17;
            if ((pbVar17 == pbVar11) || (0x20 < (ulong)*pbVar17)) break;
          } while ((0x100002600U >> ((ulong)*pbVar17 & 0x3f) & 1) != 0);
          if ((pbVar17 == pbVar11) || (pbVar11 = pbVar17, *pbVar17 != 0x22)) break;
        } while( true );
      }
LAB_00143d6f:
      pCVar4 = pMVar10->begin_;
      *(undefined4 *)(unaff_RBX + 0x30) = unaff_R13D;
      *(long *)(unaff_RBX + 0x38) = (long)pbVar11 - (long)pCVar4;
      return;
    }
    if (bVar2 == 0x74) {
      pMVar10 = is->is_;
      pcVar16 = pMVar10->src_;
      pcVar3 = pMVar10->end_;
      if ((pcVar16 == pcVar3) || (*pcVar16 != 't')) {
        ParseTrue<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  ();
      }
      else {
        pcVar1 = pcVar16 + 1;
        pMVar10->src_ = pcVar1;
        pcVar25 = pcVar3;
        if ((pcVar1 != pcVar3) && (pcVar25 = pcVar1, *pcVar1 == 'r')) {
          pcVar1 = pcVar16 + 2;
          pMVar10->src_ = pcVar1;
          pcVar25 = pcVar3;
          if ((pcVar1 != pcVar3) && (pcVar25 = pcVar1, *pcVar1 == 'u')) {
            pcVar1 = pcVar16 + 3;
            pMVar10->src_ = pcVar1;
            pcVar25 = pcVar3;
            if ((pcVar1 != pcVar3) && (pcVar25 = pcVar1, *pcVar1 == 'e')) {
              pMVar10->src_ = pcVar16 + 4;
              pGVar9 = internal::Stack<rapidjson::CrtAllocator>::
                       Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                                 (&handler->stack_,1);
              (pGVar9->data_).n = (Number)0x0;
              (pGVar9->data_).s.str = (Ch *)0x0;
              (pGVar9->data_).f.flags = 10;
              return;
            }
          }
        }
        if (*(int *)(this + 0x30) == 0) {
          pCVar4 = pMVar10->begin_;
          *(undefined4 *)(this + 0x30) = 3;
          *(long *)(this + 0x38) = (long)pcVar25 - (long)pCVar4;
          return;
        }
      }
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                    ,0x36e,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    if (bVar2 == 0x6e) {
      ParseNull<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                (this,is,handler);
      return;
    }
  }
  pMVar10 = is->is_;
  pbVar17 = (byte *)pMVar10->src_;
  pCVar4 = pMVar10->begin_;
  pbVar11 = (byte *)pMVar10->end_;
  if ((pbVar17 == pbVar11) || (*pbVar17 != 0x2d)) {
    bVar8 = false;
    pbVar23 = pbVar17;
  }
  else {
    pMVar10->src_ = (Ch *)(pbVar17 + 1);
    bVar8 = true;
    pbVar23 = pbVar17 + 1;
  }
  if (pbVar23 == pbVar11) {
LAB_0011023d:
    if (*(int *)(this + 0x30) == 0) {
      *(undefined4 *)(this + 0x30) = 3;
      *(long *)(this + 0x38) = (long)pbVar23 - (long)pCVar4;
      return;
    }
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                  ,0x602,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  iVar13 = (int)pbVar11;
  if (*pbVar23 == 0x30) {
    pbVar15 = pbVar23 + 1;
    pMVar10->src_ = (Ch *)pbVar15;
    dVar5 = 0.0;
    bVar31 = false;
    uVar30 = 0;
    iVar12 = 0;
    bVar7 = false;
    bVar6 = false;
    uVar19 = 0;
    goto LAB_0010fd98;
  }
  if (8 < (byte)(*pbVar23 - 0x31)) goto LAB_0011023d;
  pbVar15 = pbVar23 + 1;
  pMVar10->src_ = (Ch *)pbVar15;
  uVar19 = (int)(char)*pbVar23 - 0x30;
  dVar5 = 0.0;
  iVar21 = (int)pbVar15;
  if (bVar8) {
    if (pbVar15 != pbVar11) {
      iVar12 = 0;
LAB_0010fb75:
      if (9 < (byte)(*pbVar15 - 0x30)) goto LAB_0010fcac;
      if (uVar19 < 0xccccccc) {
LAB_0010fb8d:
        pbVar23 = pbVar15 + 1;
        pMVar10->src_ = (Ch *)pbVar23;
        uVar19 = (uVar19 * 10 + (int)(char)*pbVar15) - 0x30;
        iVar12 = iVar12 + 1;
        pbVar15 = pbVar23;
        if (pbVar23 == pbVar11) goto LAB_0010fca1;
        goto LAB_0010fb75;
      }
      if (uVar19 != 0xccccccc) goto LAB_0010fc14;
      if (*pbVar15 != 0x39) goto LAB_0010fb8d;
      uVar19 = 0xccccccc;
LAB_0010fc14:
      uVar29 = (ulong)uVar19;
      dVar5 = 0.0;
      bVar6 = true;
      iVar28 = (int)pbVar15;
      pbVar23 = pbVar15;
      uVar30 = uVar29;
      iVar21 = iVar12;
      if (bVar8) {
        if (pbVar15 != pbVar11) {
          iVar27 = iVar12 + iVar13;
          do {
            pbVar15 = pbVar23;
            uVar30 = uVar29;
            iVar21 = iVar12;
            if (9 < (byte)(*pbVar23 - 0x30)) break;
            if ((0xccccccccccccccb < uVar29) &&
               ((uVar29 != 0xccccccccccccccc || (uVar30 = 0xccccccccccccccc, *pbVar23 == 0x39))))
            goto LAB_0010fd21;
            pbVar15 = pbVar23 + 1;
            pMVar10->src_ = (Ch *)pbVar15;
            uVar29 = (ulong)((int)(char)*pbVar23 - 0x30) + uVar29 * 10;
            iVar12 = iVar12 + 1;
            pbVar23 = pbVar15;
            uVar30 = uVar29;
            iVar21 = iVar27 - iVar28;
          } while (pbVar15 != pbVar11);
        }
      }
      else if (pbVar15 != pbVar11) {
        iVar27 = iVar12 + iVar13;
        do {
          pbVar15 = pbVar23;
          uVar30 = uVar29;
          iVar21 = iVar12;
          if (9 < (byte)(*pbVar23 - 0x30)) break;
          if ((0x1999999999999998 < uVar29) &&
             ((uVar29 != 0x1999999999999999 || (uVar30 = 0x1999999999999999, 0x35 < *pbVar23))))
          goto LAB_0010fd21;
          pbVar15 = pbVar23 + 1;
          pMVar10->src_ = (Ch *)pbVar15;
          uVar29 = (ulong)((int)(char)*pbVar23 - 0x30) + uVar29 * 10;
          iVar12 = iVar12 + 1;
          pbVar23 = pbVar15;
          uVar30 = uVar29;
          iVar21 = iVar27 - iVar28;
        } while (pbVar15 != pbVar11);
      }
      iVar12 = iVar21;
      bVar31 = false;
      bVar7 = false;
      goto LAB_0010fd98;
    }
LAB_00110226:
    iVar12 = 0;
  }
  else {
    if (pbVar15 == pbVar11) goto LAB_00110226;
    iVar12 = 0;
    do {
      if (9 < (byte)(*pbVar15 - 0x30)) goto LAB_0010fcac;
      if (0x19999998 < uVar19) {
        if (uVar19 != 0x19999999) goto LAB_0010fc14;
        if (0x35 < *pbVar15) {
          uVar19 = 0x19999999;
          goto LAB_0010fc14;
        }
      }
      pbVar23 = pbVar15 + 1;
      pMVar10->src_ = (Ch *)pbVar23;
      uVar19 = (uVar19 * 10 + (int)(char)*pbVar15) - 0x30;
      iVar12 = iVar12 + 1;
      pbVar15 = pbVar23;
    } while (pbVar23 != pbVar11);
LAB_0010fca1:
    iVar12 = iVar13 - iVar21;
  }
LAB_0010fcac:
  uVar30 = 0;
  bVar31 = false;
  bVar7 = false;
  bVar6 = false;
  goto LAB_0010fd98;
LAB_0010fd21:
  auVar32._8_4_ = (int)(uVar30 >> 0x20);
  auVar32._0_8_ = uVar30;
  auVar32._12_4_ = 0x45300000;
  dVar5 = (auVar32._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar30) - 4503599627370496.0);
  pbVar15 = pbVar23;
  while ((pbVar15 != pbVar11 && ((byte)(*pbVar15 - 0x30) < 10))) {
    pMVar10->src_ = (Ch *)(pbVar15 + 1);
    dVar5 = dVar5 * 10.0 + (double)((char)*pbVar15 + -0x30);
    pbVar15 = pbVar15 + 1;
  }
  bVar31 = true;
  bVar7 = true;
  bVar6 = true;
LAB_0010fd98:
  iVar21 = 0;
  uVar29 = (ulong)uVar19;
  if ((pbVar15 == pbVar11) || (*pbVar15 != 0x2e)) {
    iVar28 = 0;
  }
  else {
    pbVar23 = pbVar15 + 1;
    pMVar10->src_ = (Ch *)pbVar23;
    if ((pbVar23 == pbVar11) || ((byte)(*pbVar23 - 0x3a) < 0xf6)) {
      if (*(int *)(this + 0x30) == 0) {
        *(undefined4 *)(this + 0x30) = 0xe;
        *(long *)(this + 0x38) = (long)pbVar23 - (long)pCVar4;
        return;
      }
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                    ,0x62d,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    iVar28 = 0;
    if (!bVar31) {
      if (!bVar6) {
        uVar30 = uVar29;
      }
      iVar27 = 0;
      pbVar15 = pbVar23;
      do {
        pbVar24 = pbVar15;
        iVar28 = iVar27;
        if ((((char)*pbVar15 < '0') || (0x39 < *pbVar15)) || (uVar30 >> 0x35 != 0)) break;
        pbVar24 = pbVar15 + 1;
        pMVar10->src_ = (Ch *)pbVar24;
        iVar27 = iVar27 + -1;
        uVar30 = (ulong)((int)(char)*pbVar15 - 0x30) + uVar30 * 10;
        iVar12 = iVar12 + (uint)(uVar30 != 0);
        pbVar15 = pbVar24;
        iVar28 = (int)pbVar23 - iVar13;
      } while (pbVar24 != pbVar11);
      auVar33._8_4_ = (int)(uVar30 >> 0x20);
      auVar33._0_8_ = uVar30;
      auVar33._12_4_ = 0x45300000;
      dVar5 = (auVar33._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar30) - 4503599627370496.0);
      bVar7 = true;
      pbVar23 = pbVar24;
    }
    while ((pbVar15 = pbVar23, pbVar15 != pbVar11 && ((byte)(*pbVar15 - 0x30) < 10))) {
      pbVar23 = pbVar15 + 1;
      pMVar10->src_ = (Ch *)pbVar23;
      if (iVar12 < 0x11) {
        dVar5 = dVar5 * 10.0 + (double)((char)*pbVar15 + -0x30);
        iVar28 = iVar28 + -1;
        if (0.0 < dVar5) {
          iVar12 = iVar12 + 1;
        }
      }
    }
  }
  if ((pbVar15 != pbVar11) && ((*pbVar15 == 0x65 || (*pbVar15 == 0x45)))) {
    pbVar23 = pbVar15 + 1;
    pMVar10->src_ = (Ch *)pbVar23;
    uVar14 = uVar29;
    if (bVar6) {
      uVar14 = uVar30;
    }
    if (!bVar7) {
      auVar34._8_4_ = (int)(uVar14 >> 0x20);
      auVar34._0_8_ = uVar14;
      auVar34._12_4_ = 0x45300000;
      dVar5 = (auVar34._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar14) - 4503599627370496.0);
      bVar7 = true;
    }
    if ((pbVar23 == pbVar11) || ((bVar31 = *pbVar23 != 0x2b, bVar31 && (*pbVar23 != 0x2d)))) {
      bVar31 = false;
    }
    else {
      pbVar23 = pbVar15 + 2;
      pMVar10->src_ = (Ch *)pbVar23;
    }
    if ((pbVar23 == pbVar11) || (9 < (byte)(*pbVar23 - 0x30))) {
      if (*(int *)(this + 0x30) == 0) {
        *(undefined4 *)(this + 0x30) = 0xf;
        *(long *)(this + 0x38) = (long)pbVar23 - (long)pCVar4;
        return;
      }
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                    ,0x682,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    pbVar15 = pbVar23 + 1;
    pMVar10->src_ = (Ch *)pbVar15;
    iVar13 = (char)*pbVar23 + -0x30;
    if (!bVar31) {
      do {
        if ((pbVar15 == pbVar11) || (9 < (byte)(*pbVar15 - 0x30))) goto LAB_00110002;
        pMVar10->src_ = (Ch *)(pbVar15 + 1);
        iVar13 = iVar13 * 10 + (int)(char)*pbVar15 + -0x30;
        pbVar15 = pbVar15 + 1;
      } while (iVar13 <= 0x134 - iVar28);
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                      ,0x67d,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0xd;
      goto LAB_00110098;
    }
    if (0 < iVar28) {
      __assert_fail("expFrac <= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                    ,0x66d,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    while ((pbVar15 != pbVar11 && ((byte)(*pbVar15 - 0x30) < 10))) {
      pbVar23 = pbVar15 + 1;
      pMVar10->src_ = (Ch *)pbVar23;
      iVar13 = iVar13 * 10 + (int)(char)*pbVar15 + -0x30;
      pbVar15 = pbVar23;
      if ((iVar28 + 0x7ffffff7) / 10 < iVar13) {
        while ((pbVar15 = pbVar23, pbVar23 != pbVar11 && ((byte)(*pbVar23 - 0x30) < 10))) {
          pbVar23 = pbVar23 + 1;
          pMVar10->src_ = (Ch *)pbVar23;
        }
      }
    }
LAB_00110002:
    iVar21 = -iVar13;
    if (!bVar31) {
      iVar21 = iVar13;
    }
  }
  if (!bVar7) {
    if (!bVar6) {
      if (bVar8) {
        pGVar9 = internal::Stack<rapidjson::CrtAllocator>::
                 Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                           (&handler->stack_,1);
        (pGVar9->data_).s.str = (Ch *)0x0;
        *(long *)&pGVar9->data_ = (long)(int)-uVar19;
        uVar18 = 0xb6;
        if ((int)uVar19 < 1) {
          uVar18 = 0x1f6;
        }
        (pGVar9->data_).f.flags = uVar18;
        return;
      }
      pGVar9 = internal::Stack<rapidjson::CrtAllocator>::
               Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                         (&handler->stack_,1);
      (pGVar9->data_).s.str = (Ch *)0x0;
      *(ulong *)&pGVar9->data_ = uVar29;
      (pGVar9->data_).f.flags = (ushort)(-1 < (int)uVar19) << 5 | 0x1d6;
      return;
    }
    if (!bVar8) {
      pGVar9 = internal::Stack<rapidjson::CrtAllocator>::
               Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                         (&handler->stack_,1);
      (pGVar9->data_).s.str = (Ch *)0x0;
      *(ulong *)&pGVar9->data_ = uVar30;
      uVar26 = (ushort)(uVar30 < 0x80000000) << 5 | 0x1d6;
      if (uVar30 >> 0x20 != 0) {
        uVar26 = (ushort)(-1 < (long)uVar30) << 7 | 0x116;
      }
      (pGVar9->data_).f.flags = uVar26;
      return;
    }
    bVar8 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::Int64(handler,-uVar30);
    if (bVar8) {
      return;
    }
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                    ,0x6c9,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    *(undefined4 *)(this + 0x30) = 0x10;
LAB_00110098:
    *(long *)(this + 0x38) = (long)pbVar17 - (long)pCVar4;
    return;
  }
  uVar19 = iVar21 + iVar28;
  if ((int)uVar19 < -0x134) {
    NStack_48.i64 = 0;
    if (uVar19 < 0xfffffd98) goto LAB_001101cc;
    NStack_48.d = (dVar5 / 1e+308) /
                  *(double *)(internal::Pow10(int)::e + (ulong)(-uVar19 - 0x134) * 8);
  }
  else if ((int)uVar19 < 0) {
    NStack_48.d = dVar5 / *(double *)(internal::Pow10(int)::e + (ulong)-uVar19 * 8);
  }
  else {
    if (0x134 < uVar19) {
      __assert_fail("n >= 0 && n <= 308",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/internal/pow10.h"
                    ,0x30,"double rapidjson::internal::Pow10(int)");
    }
    NStack_48.d = dVar5 * *(double *)(internal::Pow10(int)::e + (ulong)uVar19 * 8);
  }
  if (1.79769313486232e+308 < NStack_48.d) {
    if (*(int *)(this + 0x30) == 0) {
      *(undefined4 *)(this + 0x30) = 0xd;
      *(long *)(this + 0x38) = (long)pbVar17 - (long)pCVar4;
      return;
    }
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                  ,0x6b1,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
LAB_001101cc:
  if (bVar8) {
    NStack_48.u64 = NStack_48.u64 ^ 0x8000000000000000;
  }
  pGVar9 = internal::Stack<rapidjson::CrtAllocator>::
           Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                     (&handler->stack_,1);
  (pGVar9->data_).s.str = (Ch *)0x216000000000000;
  (pGVar9->data_).n = NStack_48;
  return;
}

Assistant:

Ch Peek() const { return is_.Peek(); }